

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestOneof2_NestedMessage::_InternalSerialize
          (TestOneof2_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.moo_int_,target);
  }
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar10) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      _InternalSerialize();
    }
    this_00 = &(this->field_0)._impl_.corge_int_;
    *target = 0x12;
    pbVar6 = target + 1;
    uVar9 = uVar10;
    if (0x7f < uVar10) {
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar2 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar10;
    if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      piVar4 = (int *)((long)&this->field_0 + 0x10);
    }
    else {
      piVar4 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
    }
    target = target + 2;
    iVar3 = google::protobuf::internal::SooRep::size
                      (&this_00->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    piVar1 = piVar4 + iVar3;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = (ulong)*piVar4;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *target = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          target = target + 1;
          bVar2 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar2);
      }
      piVar4 = piVar4 + 1;
      *target = (byte)uVar7;
      target = target + 1;
    } while (piVar4 < piVar1);
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneof2_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestOneof2.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 moo_int = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_moo_int(), target);
  }

  // repeated int32 corge_int = 2;
  {
    int byte_size = this_._impl_._corge_int_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_corge_int(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestOneof2.NestedMessage)
  return target;
}